

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  secp256k1_modinv64_signed62 *b;
  long lVar14;
  secp256k1_modinv64_signed62 *psVar15;
  undefined4 in_register_0000003c;
  secp256k1_modinv64_signed62 *a;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  
  a = (secp256k1_modinv64_signed62 *)CONCAT44(in_register_0000003c,len);
  if (len < 1) {
LAB_00143ec0:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00143ec5:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00143eca:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00143ecf:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00143ed4:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00143ed9:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar19 = t->u;
    lVar1 = t->v;
    lVar17 = f->v[0];
    lVar12 = g->v[0];
    uVar5 = lVar17 * lVar19;
    lVar10 = SUB168(SEXT816(lVar17) * SEXT816(lVar19),8);
    uVar6 = lVar12 * lVar1;
    lVar11 = SUB168(SEXT816(lVar12) * SEXT816(lVar1),8);
    lVar2 = (0x7fffffffffffffff - lVar11) - lVar10;
    if (-1 < lVar11 &&
        (SBORROW8(0x7fffffffffffffff - lVar11,lVar10) != SBORROW8(lVar2,(ulong)(~uVar6 < uVar5))) !=
        (long)(lVar2 - (ulong)(~uVar6 < uVar5)) < 0) goto LAB_00143ec5;
    lVar2 = t->q;
    lVar16 = lVar11 + lVar10 + (ulong)CARRY8(uVar6,uVar5);
    lVar10 = t->r;
    uVar7 = lVar17 * lVar2;
    lVar11 = SUB168(SEXT816(lVar17) * SEXT816(lVar2),8);
    uVar8 = lVar12 * lVar10;
    lVar12 = SUB168(SEXT816(lVar12) * SEXT816(lVar10),8);
    uVar18 = (ulong)(-uVar8 - 1 < uVar7);
    lVar17 = (0x7fffffffffffffff - lVar12) - lVar11;
    if (-1 < lVar12 &&
        (SBORROW8(0x7fffffffffffffff - lVar12,lVar11) != SBORROW8(lVar17,uVar18)) !=
        (long)(lVar17 - uVar18) < 0) goto LAB_00143eca;
    lVar17 = lVar12 + lVar11 + (ulong)CARRY8(uVar8,uVar7);
    if ((uVar6 + uVar5 & 0x3fffffffffffffff) != 0) goto LAB_00143ecf;
    if ((uVar8 + uVar7 & 0x3fffffffffffffff) != 0) goto LAB_00143ed4;
    uVar18 = uVar8 + uVar7 >> 0x3e | lVar17 * 4;
    uVar5 = uVar6 + uVar5 >> 0x3e | lVar16 * 4;
    lVar17 = lVar17 >> 0x3e;
    lVar16 = lVar16 >> 0x3e;
    if (len != 1) {
      a = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar12 = f->v[(long)a];
        uVar7 = lVar12 * lVar19 + uVar5;
        lVar14 = SUB168(SEXT816(lVar12) * SEXT816(lVar19),8) + lVar16 +
                 (ulong)CARRY8(lVar12 * lVar19,uVar5);
        lVar11 = g->v[(long)a];
        uVar6 = lVar11 * lVar1;
        lVar13 = SUB168(SEXT816(lVar11) * SEXT816(lVar1),8);
        uVar5 = (ulong)(-uVar6 - 1 < uVar7);
        lVar16 = (0x7fffffffffffffff - lVar13) - lVar14;
        psVar15 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar20 = (-0x8000000000000000 - lVar13) - (ulong)(uVar6 != 0);
        lVar21 = lVar14 - lVar20;
        bVar3 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar14) != SBORROW8(lVar16,uVar5)) ==
                (long)(lVar16 - uVar5) < 0;
        if (lVar13 < 0) {
          bVar3 = (SBORROW8(lVar14,lVar20) != SBORROW8(lVar21,(ulong)(uVar7 < -uVar6))) ==
                  (long)(lVar21 - (ulong)(uVar7 < -uVar6)) < 0;
        }
        if (!bVar3) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00143ebb:
          f = psVar15;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00143ec0;
        }
        uVar9 = lVar12 * lVar2 + uVar18;
        lVar21 = SUB168(SEXT816(lVar12) * SEXT816(lVar2),8) + lVar17 +
                 (ulong)CARRY8(lVar12 * lVar2,uVar18);
        uVar8 = lVar11 * lVar10;
        lVar11 = SUB168(SEXT816(lVar11) * SEXT816(lVar10),8);
        uVar5 = (ulong)(-uVar8 - 1 < uVar9);
        lVar17 = (0x7fffffffffffffff - lVar11) - lVar21;
        lVar16 = (-0x8000000000000000 - lVar11) - (ulong)(uVar8 != 0);
        lVar12 = lVar21 - lVar16;
        bVar3 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar21) != SBORROW8(lVar17,uVar5)) ==
                (long)(lVar17 - uVar5) < 0;
        if (lVar11 < 0) {
          bVar3 = (SBORROW8(lVar21,lVar16) != SBORROW8(lVar12,(ulong)(uVar9 < -uVar8))) ==
                  (long)(lVar12 - (ulong)(uVar9 < -uVar8)) < 0;
        }
        if (!bVar3) goto LAB_00143ebb;
        lVar16 = lVar13 + lVar14 + (ulong)CARRY8(uVar6,uVar7);
        lVar17 = lVar11 + lVar21 + (ulong)CARRY8(uVar8,uVar9);
        uVar5 = lVar16 * 4 | uVar6 + uVar7 >> 0x3e;
        f->v[(long)((long)a[-1].v + 0x27)] = uVar6 + uVar7 & 0x3fffffffffffffff;
        uVar18 = lVar17 * 4 | uVar8 + uVar9 >> 0x3e;
        g->v[(long)((long)a[-1].v + 0x27)] = uVar8 + uVar9 & 0x3fffffffffffffff;
        a = (secp256k1_modinv64_signed62 *)((long)a->v + 1);
        lVar17 = lVar17 >> 0x3e;
        lVar16 = lVar16 >> 0x3e;
      } while ((secp256k1_modinv64_signed62 *)(ulong)(uint)len != a);
    }
    if (lVar16 + -1 + (ulong)(0x7fffffffffffffff < uVar5) != -1) goto LAB_00143ed9;
    f->v[(long)len + -1] = uVar5;
    if (lVar17 + -1 + (ulong)(0x7fffffffffffffff < uVar18) == -1) {
      g->v[(long)len + -1] = uVar18;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar19 = a->v[0];
  lVar1 = a->v[1];
  lVar17 = a->v[2];
  lVar12 = a->v[3];
  lVar2 = a->v[4];
  lVar10 = 0;
  do {
    if (a->v[lVar10] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014410f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00144114;
    }
    if (0x3fffffffffffffff < a->v[lVar10]) goto LAB_0014410f;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,b,-2);
  if (iVar4 < 1) {
LAB_00144114:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00144119:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014411e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,b,1);
    if (-1 < iVar4) goto LAB_00144119;
    uVar5 = lVar2 >> 0x3f;
    uVar7 = (long)f >> 0x3f;
    uVar6 = ((uVar5 & b->v[0]) + lVar19 ^ uVar7) - uVar7;
    uVar8 = ((long)uVar6 >> 0x3e) + (((uVar5 & b->v[1]) + lVar1 ^ uVar7) - uVar7);
    uVar9 = ((long)uVar8 >> 0x3e) + ((lVar17 + (uVar5 & b->v[2]) ^ uVar7) - uVar7);
    uVar18 = ((long)uVar9 >> 0x3e) + (((uVar5 & b->v[3]) + lVar12 ^ uVar7) - uVar7);
    lVar19 = ((long)uVar18 >> 0x3e) + (((uVar5 & b->v[4]) + lVar2 ^ uVar7) - uVar7);
    uVar7 = lVar19 >> 0x3f;
    uVar5 = (b->v[0] & uVar7) + (uVar6 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar5 >> 0x3e) + (b->v[1] & uVar7) + (uVar8 & 0x3fffffffffffffff);
    uVar6 = ((long)uVar8 >> 0x3e) + (b->v[2] & uVar7) + (uVar9 & 0x3fffffffffffffff);
    uVar18 = ((long)uVar6 >> 0x3e) + (b->v[3] & uVar7) + (uVar18 & 0x3fffffffffffffff);
    uVar7 = (b->v[4] & uVar7) + lVar19 + ((long)uVar18 >> 0x3e);
    a->v[0] = uVar5 & 0x3fffffffffffffff;
    a->v[1] = uVar8 & 0x3fffffffffffffff;
    a->v[2] = uVar6 & 0x3fffffffffffffff;
    a->v[3] = uVar18 & 0x3fffffffffffffff;
    a->v[4] = uVar7;
    if (0x3fffffffffffffff < uVar7) goto LAB_0014411e;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(a,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_00144128;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00144128:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}